

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void xmlFormatError(xmlError *err,xmlGenericErrorFunc channel,void *data)

{
  int iVar1;
  uint uVar2;
  xmlErrorLevel xVar3;
  void *pvVar4;
  xmlParserInputPtr pxVar5;
  uint uVar6;
  int iVar7;
  char *str;
  uint uVar8;
  long lVar9;
  void *pvVar10;
  char *pcVar11;
  xmlParserInputPtr input;
  xmlChar buf [150];
  xmlParserInputPtr local_f0;
  undefined2 local_c8 [76];
  
  if (channel == (xmlGenericErrorFunc)0x0 || err == (xmlError *)0x0) {
    return;
  }
  iVar1 = err->code;
  if (iVar1 == 0) {
    return;
  }
  uVar2 = err->domain;
  pvVar4 = err->node;
  pvVar10 = (void *)0x0;
  if ((uVar2 < 0x18) && ((0x80013aU >> (uVar2 & 0x1f) & 1) != 0)) {
    pvVar10 = err->ctxt;
  }
  if ((pvVar4 == (void *)0x0) || (uVar2 == 0x11 || *(int *)((long)pvVar4 + 8) != 1)) {
    lVar9 = 0;
  }
  else {
    lVar9 = *(long *)((long)pvVar4 + 0x10);
  }
  xVar3 = err->level;
  str = err->message;
  uVar8 = err->line;
  if ((pvVar10 == (void *)0x0) ||
     (pxVar5 = *(xmlParserInputPtr *)((long)pvVar10 + 0x38), pxVar5 == (xmlParserInputPtr)0x0)) {
    if (err->file == (char *)0x0) {
      input = (xmlParserInputPtr)0x0;
      if ((uVar8 != 0) && (uVar2 < 0x14)) {
        local_f0 = (xmlParserInputPtr)0x0;
        if ((0xf0012U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_0012e4f4;
        (*channel)(data,"Entity: line %d: ",(ulong)uVar8);
      }
    }
    else {
      (*channel)(data,"%s:%d: ");
    }
    input = (xmlParserInputPtr)0x0;
    local_f0 = (xmlParserInputPtr)0x0;
  }
  else {
    if ((pxVar5->filename == (char *)0x0) && (1 < (long)*(int *)((long)pvVar10 + 0x40))) {
      input = *(xmlParserInputPtr *)
               (*(long *)((long)pvVar10 + 0x48) + -0x10 + (long)*(int *)((long)pvVar10 + 0x40) * 8);
      local_f0 = pxVar5;
    }
    else {
      local_f0 = (xmlParserInputPtr)0x0;
      input = pxVar5;
    }
    if (input->filename == (char *)0x0) {
      if (uVar8 != 0 && uVar2 == 1) {
        (*channel)(data,"Entity: line %d: ",(ulong)(uint)input->line);
      }
    }
    else {
      (*channel)(data,"%s:%d: ",input->filename,(ulong)(uint)input->line);
    }
  }
LAB_0012e4f4:
  if (lVar9 != 0) {
    (*channel)(data,"element %s: ",lVar9);
  }
  uVar6 = uVar2 - 1;
  if ((uVar6 < 0x1e) && ((0x3e7fbcfdU >> (uVar6 & 0x1f) & 1) != 0)) {
    (*channel)(data,&DAT_001cdb64 + *(int *)(&DAT_001cdb64 + (ulong)uVar6 * 4));
  }
  if (xVar3 < 4) {
    (*channel)(data,&DAT_001cdbdc + *(int *)(&DAT_001cdbdc + (ulong)xVar3 * 4));
  }
  if ((xmlChar *)str == (xmlChar *)0x0) {
    pcVar11 = "%s\n";
    str = "No error message provided";
  }
  else {
    uVar6 = xmlStrlen((xmlChar *)str);
    if (((int)uVar6 < 1) || (((xmlChar *)str)[(ulong)uVar6 - 1] == '\n')) {
      pcVar11 = "%s";
    }
    else {
      pcVar11 = "%s\n";
    }
  }
  (*channel)(data,pcVar11,str);
  if (pvVar10 == (void *)0x0) goto LAB_0012e6cd;
  if (input != (xmlParserInputPtr)0x0) {
    if (input->buf == (xmlParserInputBufferPtr)0x0) {
      if (iVar1 == 0x51) goto LAB_0012e60b;
    }
    else if ((iVar1 == 0x51) && (input->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
LAB_0012e60b:
      if (input->cur < input->end) {
        (*channel)(data,"Bytes:");
        lVar9 = 0;
        do {
          if (input->end <= input->cur + lVar9) break;
          (*channel)(data," 0x%02X",(ulong)input->cur[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        (*channel)(data,"\n");
      }
    }
  }
  xmlParserPrintFileContextInternal(input,channel,data);
  if (local_f0 != (xmlParserInputPtr)0x0) {
    if (local_f0->filename == (char *)0x0) {
      if (uVar8 != 0 && uVar2 == 1) {
        (*channel)(data,"Entity: line %d: \n",(ulong)(uint)local_f0->line);
      }
    }
    else {
      (*channel)(data,"%s:%d: \n",local_f0->filename,(ulong)(uint)local_f0->line);
    }
    xmlParserPrintFileContextInternal(local_f0,channel,data);
  }
LAB_0012e6cd:
  if ((((uVar2 == 0xc) && ((xmlChar *)err->str1 != (xmlChar *)0x0)) &&
      (iVar1 = err->int1, iVar1 < 100)) && (iVar7 = xmlStrlen((xmlChar *)err->str1), iVar1 < iVar7))
  {
    (*channel)(data,"%s\n",err->str1);
    uVar2 = err->int1;
    uVar8 = 0;
    if (0 < (long)(int)uVar2) {
      memset(local_c8,0x20,(long)(int)uVar2);
      uVar8 = uVar2;
    }
    *(undefined2 *)((long)local_c8 + (ulong)uVar8) = 0x5e;
    (*channel)(data,"%s\n",local_c8);
  }
  return;
}

Assistant:

void
xmlFormatError(const xmlError *err, xmlGenericErrorFunc channel, void *data)
{
    const char *message;
    const char *file;
    int line;
    int code;
    int domain;
    const xmlChar *name = NULL;
    xmlNodePtr node;
    xmlErrorLevel level;
    xmlParserCtxtPtr ctxt = NULL;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;

    if ((err == NULL) || (channel == NULL))
        return;

    message = err->message;
    file = err->file;
    line = err->line;
    code = err->code;
    domain = err->domain;
    level = err->level;
    node = err->node;

    if (code == XML_ERR_OK)
        return;

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = err->ctxt;
    }

    if ((node != NULL) && (node->type == XML_ELEMENT_NODE) &&
        (domain != XML_FROM_SCHEMASV))
        name = node->name;

    /*
     * Maintain the compatibility with the legacy error handling
     */
    if ((ctxt != NULL) && (ctxt->input != NULL)) {
        input = ctxt->input;
        if ((input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            cur = input;
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        if (input->filename)
            channel(data, "%s:%d: ", input->filename, input->line);
        else if ((line != 0) && (domain == XML_FROM_PARSER))
            channel(data, "Entity: line %d: ", input->line);
    } else {
        if (file != NULL)
            channel(data, "%s:%d: ", file, line);
        else if ((line != 0) &&
	         ((domain == XML_FROM_PARSER) || (domain == XML_FROM_SCHEMASV)||
		  (domain == XML_FROM_SCHEMASP)||(domain == XML_FROM_DTD) ||
		  (domain == XML_FROM_RELAXNGP)||(domain == XML_FROM_RELAXNGV)))
            channel(data, "Entity: line %d: ", line);
    }
    if (name != NULL) {
        channel(data, "element %s: ", name);
    }
    switch (domain) {
        case XML_FROM_PARSER:
            channel(data, "parser ");
            break;
        case XML_FROM_NAMESPACE:
            channel(data, "namespace ");
            break;
        case XML_FROM_DTD:
        case XML_FROM_VALID:
            channel(data, "validity ");
            break;
        case XML_FROM_HTML:
            channel(data, "HTML parser ");
            break;
        case XML_FROM_MEMORY:
            channel(data, "memory ");
            break;
        case XML_FROM_OUTPUT:
            channel(data, "output ");
            break;
        case XML_FROM_IO:
            channel(data, "I/O ");
            break;
        case XML_FROM_XINCLUDE:
            channel(data, "XInclude ");
            break;
        case XML_FROM_XPATH:
            channel(data, "XPath ");
            break;
        case XML_FROM_XPOINTER:
            channel(data, "parser ");
            break;
        case XML_FROM_REGEXP:
            channel(data, "regexp ");
            break;
        case XML_FROM_MODULE:
            channel(data, "module ");
            break;
        case XML_FROM_SCHEMASV:
            channel(data, "Schemas validity ");
            break;
        case XML_FROM_SCHEMASP:
            channel(data, "Schemas parser ");
            break;
        case XML_FROM_RELAXNGP:
            channel(data, "Relax-NG parser ");
            break;
        case XML_FROM_RELAXNGV:
            channel(data, "Relax-NG validity ");
            break;
        case XML_FROM_CATALOG:
            channel(data, "Catalog ");
            break;
        case XML_FROM_C14N:
            channel(data, "C14N ");
            break;
        case XML_FROM_XSLT:
            channel(data, "XSLT ");
            break;
        case XML_FROM_I18N:
            channel(data, "encoding ");
            break;
        case XML_FROM_SCHEMATRONV:
            channel(data, "schematron ");
            break;
        case XML_FROM_BUFFER:
            channel(data, "internal buffer ");
            break;
        case XML_FROM_URI:
            channel(data, "URI ");
            break;
        default:
            break;
    }
    switch (level) {
        case XML_ERR_NONE:
            channel(data, ": ");
            break;
        case XML_ERR_WARNING:
            channel(data, "warning : ");
            break;
        case XML_ERR_ERROR:
            channel(data, "error : ");
            break;
        case XML_ERR_FATAL:
            channel(data, "error : ");
            break;
    }
    if (message != NULL) {
        int len;
	len = xmlStrlen((const xmlChar *) message);
	if ((len > 0) && (message[len - 1] != '\n'))
	    channel(data, "%s\n", message);
	else
	    channel(data, "%s", message);
    } else {
        channel(data, "%s\n", "No error message provided");
    }

    if (ctxt != NULL) {
        if ((input != NULL) &&
            ((input->buf == NULL) || (input->buf->encoder == NULL)) &&
            (code == XML_ERR_INVALID_ENCODING) &&
            (input->cur < input->end)) {
            int i;

            channel(data, "Bytes:");
            for (i = 0; i < 4; i++) {
                if (input->cur + i >= input->end)
                    break;
                channel(data, " 0x%02X", input->cur[i]);
            }
            channel(data, "\n");
        }

        xmlParserPrintFileContextInternal(input, channel, data);

        if (cur != NULL) {
            if (cur->filename)
                channel(data, "%s:%d: \n", cur->filename, cur->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: \n", cur->line);
            xmlParserPrintFileContextInternal(cur, channel, data);
        }
    }
    if ((domain == XML_FROM_XPATH) && (err->str1 != NULL) &&
        (err->int1 < 100) &&
	(err->int1 < xmlStrlen((const xmlChar *)err->str1))) {
	xmlChar buf[150];
	int i;

	channel(data, "%s\n", err->str1);
	for (i=0;i < err->int1;i++)
	     buf[i] = ' ';
	buf[i++] = '^';
	buf[i] = 0;
	channel(data, "%s\n", buf);
    }
}